

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O2

void trico_fill_code_double(uint8_t **out,uint64_t *xor1,uint64_t *xor2,uint64_t *bcode)

{
  byte *pbVar1;
  uint8_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  uint32_t k;
  long lVar6;
  uint64_t *puVar7;
  uint8_t uVar8;
  
  uVar3 = bcode[1];
  uVar4 = *bcode;
  pbVar1 = *out;
  *out = pbVar1 + 1;
  *pbVar1 = (byte)((int)uVar3 << 4) | (byte)(int)uVar4;
  lVar5 = 0;
  lVar6 = 0;
  do {
    if (lVar5 == 0x10) {
      return;
    }
    if (0xe < *(long *)((long)bcode + lVar5) - 1U) goto LAB_001071af;
    puVar7 = xor1 + lVar6;
    switch(*(long *)((long)bcode + lVar5)) {
    case 8:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 7);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 7:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 6);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 6:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 5);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 5:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 4);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 4:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 3);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 3:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 2);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 2:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 1);
      goto LAB_001070cb;
    case 0xe:
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 5);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 0xd:
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 4);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 0xc:
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 3);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 0xb:
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 2);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 10:
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 1);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    case 9:
      puVar7 = xor2 + lVar6;
      break;
    case 0xf:
      puVar7 = (uint64_t *)((long)xor2 + lVar5);
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 6);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 5);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 4);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 3);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 2);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 1);
LAB_001070cb:
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
    }
    uVar3 = *puVar7;
    puVar2 = *out;
    *out = puVar2 + 1;
    *puVar2 = (uint8_t)uVar3;
LAB_001071af:
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

static inline void trico_fill_code_double(uint8_t** out, uint64_t* xor1, uint64_t* xor2, uint64_t* bcode)
  {
  uint8_t bc = (uint8_t)((bcode[1] << 4) | bcode[0]);

  *(*out)++ = bc;

  for (uint32_t k = 0; k < 2; ++k)
    {
    switch (bcode[k])
      {
      case 0:
      {
      break;
      }
      case 1:
      {
      *(*out)++ = (uint8_t)(xor1[k]);
      break;
      }
      case 2:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 3:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 16));
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 4:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 24));
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 5:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 32));
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 6:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 40));
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 7:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 48));
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 8:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 56));
      *(*out)++ = (uint8_t)((xor1[k] >> 48) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 9:
      {
      *(*out)++ = (uint8_t)(xor2[k]);
      break;
      }
      case 10:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 11:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 16));
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 12:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 24));
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 13:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 32));
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 14:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 40));
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 15:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 48));
      *(*out)++ = (uint8_t)((xor2[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      }
    }
  }